

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O3

int __thiscall Nes_Apu::read_status(Nes_Apu *this,cpu_time_t time)

{
  int i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  run_until(this,time + -1);
  uVar3 = (uint)this->irq_flag << 6 | (uint)(this->dmc).irq_flag << 7;
  lVar1 = 0;
  do {
    uVar2 = 1 << ((byte)lVar1 & 0x1f);
    if (this->oscs[lVar1]->length_counter == 0) {
      uVar2 = 0;
    }
    uVar3 = uVar3 | uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  run_until(this,time);
  if (this->irq_flag != false) {
    this->irq_flag = false;
    irq_changed(this);
  }
  return uVar3;
}

Assistant:

int Nes_Apu::read_status( cpu_time_t time )
{
	run_until( time - 1 );
	
	int result = (dmc.irq_flag << 7) | (irq_flag << 6);
	
	for ( int i = 0; i < osc_count; i++ )
		if ( oscs [i]->length_counter )
			result |= 1 << i;
	
	run_until( time );
	
	if ( irq_flag ) {
		irq_flag = false;
		irq_changed();
	}
	
	return result;
}